

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_storage.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::posix_storage::set_file_priority
          (posix_storage *this,vector<download_priority_t,_file_index_t> *prio,storage_error *ec)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  value_type *pvVar5;
  int64_t offset;
  int64_t size;
  pointer ppVar6;
  undefined1 local_c0 [3];
  bool file_exists;
  string fp;
  anon_class_24_3_ecb209a8 local_80;
  function<void_(long,_libtorrent::span<char>)> local_68;
  int local_48;
  int local_44;
  strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> local_3d;
  int local_3c;
  download_priority_t new_prio;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> sStack_30;
  download_priority_t old_prio;
  file_index_t local_2c;
  file_storage *pfStack_28;
  file_index_t i;
  file_storage *fs;
  storage_error *ec_local;
  vector<download_priority_t,_file_index_t> *prio_local;
  posix_storage *this_local;
  
  sVar3 = ::std::
          vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          ::size(&prio->
                  super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                );
  sVar4 = ::std::
          vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          ::size(&(this->m_file_priority).
                  super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                );
  if (sVar4 < sVar3) {
    sVar3 = ::std::
            vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
            ::size(&prio->
                    super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                  );
    container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
    ::resize(&this->m_file_priority,sVar3,
             (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *)
             &default_priority);
  }
  pfStack_28 = files(this);
  memset(&local_2c,0,4);
  do {
    sStack_30 = container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
                ::end_index(prio);
    bVar1 = strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator<
                      (&local_2c,&stack0xffffffffffffffd0);
    if (!bVar1) {
      bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_part_file);
      if (bVar1) {
        ppVar6 = ::std::
                 unique_ptr<libtorrent::aux::posix_part_file,_std::default_delete<libtorrent::aux::posix_part_file>_>
                 ::operator->(&this->m_part_file);
        posix_part_file::flush_metadata(ppVar6,&ec->ec);
      }
      bVar1 = storage_error::operator_cast_to_bool(ec);
      if (bVar1) {
        storage_error::file(ec,(file_index_t)0xfffffffa);
        ec->operation = partfile_write;
      }
      return;
    }
    bVar1 = file_storage::pad_file_at(pfStack_28,local_2c);
    if (!bVar1) {
      local_3c = local_2c.m_val;
      pvVar5 = container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
               ::operator[](&this->m_file_priority,
                            (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)
                            local_2c.m_val);
      new_prio.m_val = pvVar5->m_val;
      local_44 = local_2c.m_val;
      pvVar5 = container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
               ::operator[](prio,(strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)
                                 local_2c.m_val);
      local_3d.m_val = pvVar5->m_val;
      bVar1 = strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>::operator==
                        (&new_prio,
                         (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *)
                         &dont_download);
      if ((bVar1) &&
         (bVar1 = strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>::operator!=
                            (&local_3d,
                             (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>
                              *)&dont_download), bVar1)) {
        bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_part_file);
        if (bVar1) {
          local_48 = local_2c.m_val;
          bVar1 = use_partfile(this,local_2c);
          if (bVar1) {
            ppVar6 = ::std::
                     unique_ptr<libtorrent::aux::posix_part_file,_std::default_delete<libtorrent::aux::posix_part_file>_>
                     ::operator->(&this->m_part_file);
            local_80.i.m_val = local_2c.m_val;
            local_80.this = this;
            local_80.ec = ec;
            ::std::function<void(long,libtorrent::span<char>)>::
            function<libtorrent::aux::posix_storage::set_file_priority(libtorrent::aux::container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>&,libtorrent::storage_error&)::__0,void>
                      ((function<void(long,libtorrent::span<char>)> *)&local_68,&local_80);
            offset = file_storage::file_offset(pfStack_28,local_2c);
            size = file_storage::file_size(pfStack_28,local_2c);
            posix_part_file::export_file(ppVar6,&local_68,offset,size,&ec->ec);
            ::std::function<void_(long,_libtorrent::span<char>)>::~function(&local_68);
            bVar1 = storage_error::operator_cast_to_bool(ec);
            if (bVar1) {
              fp.field_2._12_4_ = local_2c.m_val;
              storage_error::file(ec,local_2c);
              ec->operation = partfile_write;
              container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
              ::operator=(prio,&this->m_file_priority);
              return;
            }
          }
        }
      }
      else {
        bVar1 = strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>::operator!=
                          (&new_prio,
                           (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *
                           )&dont_download);
        if ((bVar1) &&
           (bVar1 = strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>::
                    operator==(&local_3d,
                               (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>
                                *)&dont_download), bVar1)) {
          file_storage::file_path((string *)local_c0,pfStack_28,local_2c,&this->m_save_path);
          bVar1 = exists((string *)local_c0,&ec->ec);
          bVar2 = boost::system::error_code::operator_cast_to_bool(&ec->ec);
          if (bVar2) {
            storage_error::file(ec,local_2c);
            ec->operation = file_stat;
            container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
            ::operator=(prio,&this->m_file_priority);
          }
          else {
            use_partfile(this,local_2c,(bool)(~bVar1 & 1));
          }
          ::std::__cxx11::string::~string((string *)local_c0);
          if (bVar2) {
            return;
          }
        }
      }
      boost::system::error_code::clear(&ec->ec);
      pvVar5 = container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
               ::operator[](&this->m_file_priority,
                            (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)
                            local_2c.m_val);
      pvVar5->m_val = local_3d.m_val;
      pvVar5 = container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
               ::operator[](&this->m_file_priority,
                            (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)
                            local_2c.m_val);
      bVar1 = strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>::operator==
                        (pvVar5,(strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>
                                 *)&dont_download);
      if ((bVar1) && (bVar1 = use_partfile(this,local_2c), bVar1)) {
        need_partfile(this);
      }
    }
    strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator++(&local_2c);
  } while( true );
}

Assistant:

void posix_storage::set_file_priority(aux::vector<download_priority_t, file_index_t>& prio
		, storage_error& ec)
	{
		// extend our file priorities in case it's truncated
		// the default assumed priority is 4 (the default)
		if (prio.size() > m_file_priority.size())
			m_file_priority.resize(prio.size(), default_priority);

		file_storage const& fs = files();
		for (file_index_t i(0); i < prio.end_index(); ++i)
		{
			// pad files always have priority 0.
			if (fs.pad_file_at(i)) continue;

			download_priority_t const old_prio = m_file_priority[i];
			download_priority_t new_prio = prio[i];
			if (old_prio == dont_download && new_prio != dont_download)
			{
				if (m_part_file && use_partfile(i))
				{
					m_part_file->export_file([this, i, &ec](std::int64_t file_offset, span<char> buf)
					{
						// move stuff out of the part file
						file_pointer const f = open_file(i, open_mode::write, file_offset, ec);
						if (ec) return;
						int const r = static_cast<int>(std::fwrite(buf.data(), 1
							, static_cast<std::size_t>(buf.size()), f.file()));
						if (r != buf.size())
						{
							if (std::ferror(f.file())) ec.ec.assign(errno, generic_category());
							else ec.ec.assign(errors::file_too_short, libtorrent_category());
							return;
						}
					}, fs.file_offset(i), fs.file_size(i), ec.ec);

					if (ec)
					{
						ec.file(i);
						ec.operation = operation_t::partfile_write;
						prio = m_file_priority;
						return;
					}
				}
			}
			else if (old_prio != dont_download && new_prio == dont_download)
			{
				// move stuff into the part file
				// this is not implemented yet.
				// so we just don't use a partfile for this file

				std::string const fp = fs.file_path(i, m_save_path);
				bool const file_exists = exists(fp, ec.ec);
				if (ec.ec)
				{
					ec.file(i);
					ec.operation = operation_t::file_stat;
					prio = m_file_priority;
					return;
				}
				use_partfile(i, !file_exists);
			}
			ec.ec.clear();
			m_file_priority[i] = new_prio;

			if (m_file_priority[i] == dont_download && use_partfile(i))
			{
				need_partfile();
			}
		}
		if (m_part_file) m_part_file->flush_metadata(ec.ec);
		if (ec)
		{
			ec.file(torrent_status::error_file_partfile);
			ec.operation = operation_t::partfile_write;
		}
	}